

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O1

TValue * trace_exit_cp(lua_State *L,lua_CFunction dummy,void *ud)

{
  byte *pbVar1;
  SnapShot *pSVar2;
  IRIns *pIVar3;
  ushort uVar4;
  ushort uVar5;
  uint32_t uVar6;
  jit_State *J;
  SnapShot *pSVar7;
  SnapEntry *pSVar8;
  ExitState *ex;
  lua_State *plVar9;
  lua_State *L_00;
  IRIns *pIVar10;
  uint32_t uVar11;
  SnapShot *pSVar12;
  void *pvVar13;
  GCtab *t;
  TValue *pTVar14;
  uint8_t *puVar15;
  byte bVar16;
  uint uVar17;
  IRIns *pIVar18;
  ulong uVar19;
  long *plVar20;
  long lVar21;
  IRIns *pIVar22;
  IRIns *pIVar23;
  CTSize CVar24;
  ulong uVar25;
  GCtrace *T;
  BloomFilter rfilt;
  uint ref;
  long lVar26;
  SnapNo snapno;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  TValue *local_80;
  uint32_t *local_50;
  TValue local_48;
  byte *local_40;
  ulong local_38;
  
  *(undefined4 *)((long)L->cframe + 0x14) = 0xffffffff;
  J = *ud;
  uVar27 = (ulong)J->exitno;
  T = (GCtrace *)(ulong)J->trace[J->parent].gcptr32;
  pSVar7 = T->snap;
  pSVar2 = pSVar7 + uVar27;
  uVar25 = (ulong)pSVar2->nent;
  pSVar8 = T->snapmap;
  uVar4 = pSVar2->mapofs;
  pSVar12 = (SnapShot *)&T->nsnapmap;
  if (pSVar7 + uVar27 + 1 != pSVar7 + T->nsnap) {
    pSVar12 = pSVar7 + uVar27 + 1;
  }
  uVar28 = (ulong)(T->nins - 1);
  if (*(char *)((long)T->ir + uVar28 * 8 + 5) == '\x14') {
    pIVar18 = T->ir + uVar28;
    rfilt = 0;
    do {
      if ((uint)(pIVar18->field_0).op2 <= J->exitno) {
        rfilt = rfilt | 1L << ((ulong)*(byte *)pIVar18 & 0x3f);
      }
      pbVar1 = (byte *)((long)pIVar18 + -3);
      pIVar18 = pIVar18 + -1;
    } while (*pbVar1 == 0x14);
  }
  else {
    rfilt = 0;
  }
  uVar5 = pSVar12->mapofs;
  ex = *(ExitState **)((long)ud + 8);
  local_40 = (byte *)(ulong)pSVar8[uVar4 + uVar25];
  plVar9 = J->L;
  *(SnapEntry *)(((ulong)plVar9->cframe & 0xfffffffffffffffc) + 0x1c) = pSVar8[uVar4 + uVar25] + 4;
  if ((TValue *)(ulong)(plVar9->maxstack).ptr32 <= plVar9->base + pSVar2->topslot) {
    trace_exit_cp_cold_1();
  }
  local_80 = plVar9->base + -1;
  if (uVar25 != 0) {
    local_50 = pSVar8 + (uVar5 - 1);
    uVar6 = *(uint32_t *)((long)plVar9->base + -4);
    uVar28 = 0;
    local_38 = uVar27;
    do {
      uVar17 = pSVar8[uVar4 + uVar28];
      if ((uVar17 >> 0x12 & 1) == 0) {
        pTVar14 = local_80 + (uVar17 >> 0x18);
        ref = uVar17 & 0xffff;
        pIVar18 = T->ir;
        snapno = (SnapNo)uVar27;
        if (*(char *)((long)pIVar18 + (ulong)ref * 8 + 6) == -3) {
          if (uVar28 != 0) {
            uVar19 = 0;
            do {
              if ((pSVar8[uVar4 + uVar19] & 0xffff) == ref) {
                *pTVar14 = local_80[pSVar8[uVar4 + uVar19] >> 0x18];
                goto LAB_00112141;
              }
              uVar19 = uVar19 + 1;
            } while (uVar28 != uVar19);
          }
          pIVar3 = pIVar18 + ref;
          if ((pIVar3->field_1).o - 0x50 < 2) {
            L_00 = J->L;
            plVar20 = (long *)(ulong)*(uint *)((ulong)(L_00->glref).ptr32 + 0xfc);
            plVar20[2] = (long)L_00;
            uVar17 = pIVar18[(pIVar3->field_0).op1].field_1.op12;
            lVar26 = *plVar20;
            lVar21 = (ulong)uVar17 * 0x10;
            CVar24 = 0xffffffff;
            if (*(uint *)(lVar26 + lVar21) < 0x60000000) {
              CVar24 = *(CTSize *)(lVar26 + lVar21 + 4);
            }
            pvVar13 = lj_mem_newgco(L_00,CVar24 + 8);
            *(undefined1 *)((long)pvVar13 + 5) = 10;
            *(short *)((long)pvVar13 + 6) = (short)uVar17;
            (pTVar14->u32).lo = (uint32_t)pvVar13;
            (pTVar14->field_2).it = 0xfffffff5;
            if ((pIVar3->field_1).o == 'Q') {
              snap_restoredata(T,ex,snapno,rfilt,(uint)(pIVar3->field_0).op2,
                               (void *)((long)pvVar13 + 8),CVar24);
            }
            else {
              uVar5 = T->snap[uVar27].ref;
              pIVar18 = T->ir;
              pIVar10 = pIVar3;
joined_r0x00111ea4:
              pIVar10 = pIVar10 + 1;
              if (pIVar10 < pIVar18 + uVar5) {
                if ((pIVar10->field_1).r == 0xfe) {
                  if ((ulong)(pIVar10->field_1).s == 0xff) {
                    uVar17 = (pIVar10->field_1).o - 0x47;
                    if ((4 < uVar17) || (uVar17 == 2)) goto joined_r0x00111ea4;
                    pIVar23 = T->ir;
                    pIVar22 = pIVar23 + (pIVar10->field_0).op1;
                    if (((pIVar22->field_1).o & 0xfe) == 0x38) {
                      pIVar22 = pIVar23 + (pIVar22->field_0).op1;
                    }
                    bVar29 = pIVar23 + (pIVar22->field_0).op1 == pIVar3;
                  }
                  else {
                    bVar29 = pIVar10 == pIVar3 + (pIVar10->field_1).s;
                  }
                  if (bVar29) {
                    uVar17._0_2_ = *(IROpT *)((long)pIVar10 + 4);
                    uVar17._2_2_ = *(IRRef1 *)((long)pIVar10 + 6);
                    CVar24 = 8;
                    if ((0x604208U >> (uVar17 & 0x1f) & 1) == 0) {
                      bVar16 = ((byte)(undefined2)uVar17 & 0x1f) - 0xf;
                      CVar24 = 4;
                      if (bVar16 < 4) {
                        CVar24 = *(CTSize *)(&DAT_00155dc0 + (ulong)bVar16 * 4);
                      }
                    }
                    pIVar22 = T->ir;
                    uVar19 = (ulong)*(ushort *)
                                     ((long)pIVar22 + (ulong)(pIVar10->field_0).op1 * 8 + 2);
                    if (*(char *)((long)pIVar22 + uVar19 * 8 + 5) == '\x1c') {
                      lVar26 = *(long *)(ulong)pIVar22[uVar19].field_1.op12;
                    }
                    else {
                      lVar26 = (long)(int)pIVar22[uVar19].field_1.op12;
                    }
                    snap_restoredata(T,ex,snapno,rfilt,(uint)(pIVar10->field_0).op2,
                                     (void *)(lVar26 + (long)pvVar13),CVar24);
                  }
                }
                goto joined_r0x00111ea4;
              }
            }
          }
          else {
            if ((pIVar3->field_1).o == 0x4e) {
              t = lj_tab_new(J->L,(uint)(pIVar3->field_0).op1,(uint)(pIVar3->field_0).op2);
            }
            else {
              t = lj_tab_dup(J->L,(GCtab *)(ulong)pIVar18[(pIVar3->field_0).op1].field_1.op12);
            }
            (pTVar14->u32).lo = (uint32_t)t;
            (pTVar14->field_2).it = 0xfffffff4;
            uVar5 = T->snap[uVar27].ref;
            pIVar18 = T->ir;
            pIVar10 = pIVar3;
joined_r0x00111ffc:
            pIVar10 = pIVar10 + 1;
            if (pIVar10 < pIVar18 + uVar5) {
              if ((pIVar10->field_1).r == 0xfe) {
                if ((ulong)(pIVar10->field_1).s == 0xff) {
                  uVar17 = (pIVar10->field_1).o - 0x47;
                  if ((4 < uVar17) || (uVar17 == 2)) goto joined_r0x00111ffc;
                  pIVar23 = T->ir;
                  pIVar22 = pIVar23 + (pIVar10->field_0).op1;
                  if (((pIVar22->field_1).o & 0xfe) == 0x38) {
                    pIVar22 = pIVar23 + (pIVar22->field_0).op1;
                  }
                  bVar29 = pIVar23 + (pIVar22->field_0).op1 == pIVar3;
                }
                else {
                  bVar29 = pIVar10 == pIVar3 + (pIVar10->field_1).s;
                }
                if (bVar29) {
                  pIVar22 = T->ir;
                  if (*(char *)((long)pIVar22 + (ulong)(pIVar10->field_0).op1 * 8 + 5) == '>') {
                    snap_restoreval(J,T,ex,(SnapNo)uVar27,rfilt,(uint)(pIVar10->field_0).op2,
                                    &local_48);
                    (t->metatable).gcptr32 = (uint32_t)local_48.field_2.field_0;
                  }
                  else {
                    pIVar23 = pIVar22 + *(ushort *)
                                         ((long)pIVar22 + (ulong)(pIVar10->field_0).op1 * 8 + 2);
                    if ((pIVar23->field_1).o == '\x1d') {
                      pIVar23 = pIVar22 + (pIVar23->field_0).op1;
                    }
                    lj_ir_kvalue(J->L,&local_48,pIVar23);
                    pTVar14 = lj_tab_set(J->L,t,&local_48);
                    uVar27 = local_38;
                    snap_restoreval(J,T,ex,(SnapNo)local_38,rfilt,(uint)(pIVar10->field_0).op2,
                                    pTVar14);
                  }
                }
              }
              goto joined_r0x00111ffc;
            }
          }
        }
        else {
          snap_restoreval(J,T,ex,snapno,rfilt,ref,pTVar14);
          if ((uVar17 & 0x30000) != 0) {
            uVar11 = uVar6;
            if (0xffffff < uVar17) {
              uVar11 = *local_50;
              local_50 = local_50 + -1;
            }
            (pTVar14->field_2).it = uVar11;
            plVar9->base = pTVar14 + 1;
          }
        }
      }
LAB_00112141:
      uVar28 = uVar28 + 1;
    } while (uVar28 != uVar25);
  }
  uVar17 = *local_40 - 0x3c;
  if (((uVar17 < 10) && ((0x20bU >> (uVar17 & 0x1f) & 1) != 0)) || (0x54 < *local_40)) {
    puVar15 = &pSVar2->nslots;
  }
  else {
    local_80 = plVar9->base;
    puVar15 = (uint8_t *)((ulong)*(uint *)((ulong)local_80[-1].u32.lo + 0x10) - 0x39);
  }
  plVar9->top = local_80 + *puVar15;
  *(byte **)((long)ud + 0x10) = local_40;
  return (TValue *)0x0;
}

Assistant:

static TValue *trace_exit_cp(lua_State *L, lua_CFunction dummy, void *ud)
{
  ExitDataCP *exd = (ExitDataCP *)ud;
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  exd->pc = lj_snap_restore(exd->J, exd->exptr);
  UNUSED(dummy);
  return NULL;
}